

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O3

void __thiscall
Secp256k1_AddTweakPubkeySecp256k1EcErrorTest_Test::TestBody
          (Secp256k1_AddTweakPubkeySecp256k1EcErrorTest_Test *this)

{
  pointer paVar1;
  bool bVar2;
  secp256k1_context_struct *context;
  pointer paVar3;
  ByteData actual;
  Secp256k1 secp;
  TweakPubkeyTestVector test_vector;
  ByteData local_d0;
  AssertHelper local_b8;
  Secp256k1 local_b0;
  anon_struct_120_5_2a4d6406 local_a8;
  
  context = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(&local_b0,context);
  paVar1 = tweak_pubkey_error_vectors.
           super__Vector_base<TweakPubkeyTestVector,_std::allocator<TweakPubkeyTestVector>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (tweak_pubkey_error_vectors.
      super__Vector_base<TweakPubkeyTestVector,_std::allocator<TweakPubkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_start !=
      tweak_pubkey_error_vectors.
      super__Vector_base<TweakPubkeyTestVector,_std::allocator<TweakPubkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar3 = tweak_pubkey_error_vectors.
             super__Vector_base<TweakPubkeyTestVector,_std::allocator<TweakPubkeyTestVector>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      anon_struct_120_5_2a4d6406::TweakPubkeyTestVector(&local_a8,paVar3);
      if (local_a8.expect_add._M_string_length == 0) {
        bVar2 = testing::internal::AlwaysTrue();
        if ((bVar2) &&
           (cfd::core::Secp256k1::AddTweakPubkeySecp256k1Ec
                      (&local_d0,&local_b0,&local_a8.pubkey,&local_a8.tweak,local_a8.is_check),
           (long *)local_d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
          operator_delete(local_d0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        testing::Message::Message((Message *)&local_d0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x108,
                   "Expected: ByteData actual = secp.AddTweakPubkeySecp256k1Ec(test_vector.pubkey, test_vector.tweak, test_vector.is_check) throws an exception of type CfdException.\n  Actual: it throws nothing."
                  );
        testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        if ((((long *)local_d0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (long *)0x0) &&
            (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           ((long *)local_d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
          (**(code **)(*(long *)local_d0.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
      if (local_a8.expect_mul._M_string_length == 0) {
        bVar2 = testing::internal::AlwaysTrue();
        if ((bVar2) &&
           (cfd::core::Secp256k1::MulTweakPubkeySecp256k1Ec
                      (&local_d0,&local_b0,&local_a8.pubkey,&local_a8.tweak),
           (long *)local_d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
          operator_delete(local_d0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        testing::Message::Message((Message *)&local_d0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x10e,
                   "Expected: ByteData actual = secp.MulTweakPubkeySecp256k1Ec(test_vector.pubkey, test_vector.tweak) throws an exception of type CfdException.\n  Actual: it throws nothing."
                  );
        testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        if ((((long *)local_d0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (long *)0x0) &&
            (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           ((long *)local_d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
          (**(code **)(*(long *)local_d0.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.expect_mul._M_dataplus._M_p != &local_a8.expect_mul.field_2) {
        operator_delete(local_a8.expect_mul._M_dataplus._M_p,
                        local_a8.expect_mul.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.expect_add._M_dataplus._M_p != &local_a8.expect_add.field_2) {
        operator_delete(local_a8.expect_add._M_dataplus._M_p,
                        local_a8.expect_add.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.tweak.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.tweak.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.tweak.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.tweak.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.pubkey.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.pubkey.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.pubkey.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.pubkey.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      paVar3 = paVar3 + 1;
    } while (paVar3 != paVar1);
  }
  return;
}

Assistant:

TEST(Secp256k1, AddTweakPubkeySecp256k1EcErrorTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPubkeyTestVector test_vector : tweak_pubkey_error_vectors) {
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.AddTweakPubkeySecp256k1Ec(test_vector.pubkey,
          test_vector.tweak, test_vector.is_check),
        CfdException);
    }
    if (test_vector.expect_mul.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.MulTweakPubkeySecp256k1Ec(test_vector.pubkey,
          test_vector.tweak),
        CfdException);
    }
  }
}